

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testlist.cpp
# Opt level: O3

void __thiscall Testlist::print(Testlist *this)

{
  pointer ppEVar1;
  long lVar2;
  long lVar3;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> list;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_40;
  
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector(&local_40,&this->_list);
  ppEVar1 = (this->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->_list).
                              super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        ppEVar1 = (pointer)((long)(this->_list).
                                  super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar2);
      }
      (**(*ppEVar1)->_vptr_ExprNode)();
      lVar3 = lVar3 + 1;
      ppEVar1 = (this->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 8;
    } while (lVar3 < (int)((ulong)((long)(this->_list).
                                         super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1)
                          >> 3));
  }
  if (local_40.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Testlist::print() {
    std::vector<ExprNode*>list = getTestlist();
    for(int i = 0; i < numTests();i++){
        if(i != 0)
            std::cout << ", ";
        at(i)->print();
    }
//    for (auto e: _list) {
//        e->print();
//        std::cout << ", ";
//    }
}